

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t pax_attribute_read_time
                  (archive_read *a,size_t value_length,int64_t *ps,long *pn,size_t *unconsumed)

{
  char cVar1;
  long lVar2;
  long lVar3;
  wchar_t wVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  bool bVar13;
  archive_string local_48;
  
  if (0x80 < value_length) {
    __archive_read_consume(a,value_length);
    *ps = 0;
    *pn = 0;
    return L'\xffffffe2';
  }
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  wVar4 = read_bytes_to_string(a,&local_48,value_length,unconsumed);
  if (wVar4 < L'\0') {
    archive_string_free(&local_48);
    return wVar4;
  }
  plVar6 = ps;
  if (local_48.length != 0) {
    cVar1 = *local_48.s;
    uVar10 = -(ulong)(cVar1 == '-');
    uVar5 = uVar10 | 1;
    lVar9 = local_48.length - (cVar1 == '-');
    if (lVar9 != 0) {
      pcVar8 = local_48.s + (cVar1 == '-');
      bVar11 = local_48.s[cVar1 == '-'] - 0x30;
      if (bVar11 < 10) {
        bVar13 = false;
        lVar7 = 0;
        lVar2 = lVar9;
        lVar3 = 0;
        do {
          lVar12 = lVar3;
          lVar9 = lVar2;
          if (lVar7 == 0xccccccccccccccc && 7 < bVar11) {
            pcVar8 = pcVar8 + lVar12;
            lVar7 = 0x7fffffffffffffff;
            goto LAB_001342ff;
          }
          lVar7 = (ulong)bVar11 + lVar7 * 10;
          bVar13 = local_48.length + uVar10 + -1 == lVar12;
          if (bVar13) goto LAB_001342dd;
          bVar11 = pcVar8[lVar12 + 1] - 0x30;
          if (9 < bVar11) goto LAB_001342be;
          lVar2 = lVar9 + -1;
          lVar3 = lVar12 + 1;
        } while (lVar7 < 0xccccccccccccccd);
        lVar7 = 0x7fffffffffffffff;
LAB_001342be:
        pcVar8 = pcVar8 + lVar12 + 1;
        lVar9 = lVar9 + -1;
      }
      else {
        bVar13 = false;
        lVar7 = 0;
      }
LAB_001342ff:
      *ps = lVar7 * uVar5;
      *pn = 0;
      if ((!bVar13) && (*pcVar8 == '.')) {
        lVar7 = 1;
        uVar5 = 100000000;
        do {
          if ((lVar9 == lVar7) || (9 < (byte)(pcVar8[lVar7] - 0x30U))) break;
          *pn = *pn + (byte)(pcVar8[lVar7] - 0x30U) * uVar5;
          lVar7 = lVar7 + 1;
          bVar13 = 9 < uVar5;
          uVar5 = uVar5 / 10;
        } while (bVar13);
      }
      goto LAB_0013435b;
    }
    lVar7 = 0;
LAB_001342dd:
    *ps = lVar7 * uVar5;
    plVar6 = pn;
  }
  *plVar6 = 0;
LAB_0013435b:
  archive_string_free(&local_48);
  wVar4 = L'\xffffffec';
  if ((ulong)*ps < 0x7fffffffffffffff) {
    wVar4 = L'\0';
  }
  return wVar4;
}

Assistant:

static int
pax_attribute_read_time(struct archive_read *a, size_t value_length, int64_t *ps, long *pn, size_t *unconsumed) {
	struct archive_string as;
	int r;

	if (value_length > 128) {
		__archive_read_consume(a, value_length);
		*ps = 0;
		*pn = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	pax_time(as.s, archive_strlen(&as), ps, pn);
	archive_string_free(&as);
	if (*ps < 0 || *ps == INT64_MAX) {
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}